

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  long lVar1;
  value_type *pvVar2;
  long lVar3;
  size_t in_RCX;
  size_t start_memory;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> set;
  iterator local_c0;
  HashObject<16,_16> local_a8;
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> local_98;
  
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap(&local_98);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < iters) {
    uVar4 = 0;
    do {
      lVar1 = (ulong)(uVar4 & 0xff) * 0x101010101010101;
      local_c0.ht._4_4_ = (undefined4)lVar1;
      local_c0.pos._0_4_ = (undefined4)((ulong)lVar1 >> 0x20);
      local_c0.pos._4_4_ = local_c0.ht._4_4_;
      local_c0.ht._0_4_ = uVar4;
      pvVar2 = google::
               dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::find_or_insert<int,HashObject<16,16>>
                         ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)&local_98,(HashObject<16,_16> *)&local_c0);
      uVar4 = uVar4 + 1;
      pvVar2->second = uVar4;
    } while (iters != uVar4);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar1 = std::chrono::_V2::steady_clock::now();
  if (iters < 1) {
    uVar4 = 1;
  }
  else {
    uVar4 = 1;
    uVar5 = 0;
    do {
      local_a8.i_ = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
      local_a8.buffer_._0_8_ = (ulong)(local_a8.i_ & 0xff) * 0x101010101010101;
      local_a8.buffer_._8_4_ = SUB84(local_a8.buffer_._0_8_,0);
      google::
      dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
      ::find<HashObject<16,16>>
                (&local_c0,
                 (dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                  *)&local_98,&local_a8);
      bVar6 = (pointer)CONCAT44(local_c0.pos._4_4_,local_c0.pos._0_4_) !=
              local_98.
              super_dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
              .rep.table +
              local_98.
              super_dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
              .rep.num_buckets;
      in_RCX = (size_t)bVar6;
      uVar4 = uVar4 ^ bVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)iters != uVar5);
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  srand(uVar4);
  report(title,(double)(lVar3 - lVar1),iters,start_memory,in_RCX);
  if (local_98.
      super_dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      .rep.table != (pointer)0x0) {
    free(local_98.
         super_dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
         .rep.table);
  }
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}